

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

ssize_t __thiscall RenX::LadderDatabase::write(LadderDatabase *this,int __fd,void *__buf,size_t __n)

{
  Entry *pEVar1;
  FILE *in_RAX;
  Entry **ppEVar2;
  undefined4 in_register_00000034;
  size_t sVar3;
  DataBuffer buffer;
  
  if (this->m_entries != 0) {
    in_RAX = fopen((char *)CONCAT44(in_register_00000034,__fd),"wb");
    if (in_RAX != (FILE *)0x0) {
      Jupiter::DataBuffer::DataBuffer(&buffer);
      (**(code **)(*(long *)this + 0x10))(this,in_RAX);
      sVar3 = 1;
      ppEVar2 = &this->m_head;
      while (pEVar1 = *ppEVar2, pEVar1 != (Entry *)0x0) {
        pEVar1->rank = sVar3;
        Jupiter::DataBuffer::push<unsigned_long>(&buffer,&pEVar1->steam_id);
        Jupiter::DataBuffer::push<unsigned_long>(&buffer,&pEVar1->total_score);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_deaths);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_headshot_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_vehicle_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_building_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_defence_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_captures);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_game_time);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_games);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_wins);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_beacon_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_beacon_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_proxy_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_proxy_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_games);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_wins);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_ties);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_game_time);
        Jupiter::DataBuffer::push<unsigned_long>(&buffer,&pEVar1->total_gdi_score);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_beacon_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_beacon_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_proxy_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_proxy_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_deaths);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_vehicle_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_defence_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_building_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_gdi_headshots);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_games);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_wins);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_game_time);
        Jupiter::DataBuffer::push<unsigned_long>(&buffer,&pEVar1->total_nod_score);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_beacon_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_beacon_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_proxy_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_proxy_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_deaths);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_vehicle_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_defence_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_building_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->total_nod_headshots);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_score);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->most_deaths);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_headshot_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_vehicle_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_building_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_defence_kills);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_captures);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_game_time);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_beacon_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_beacon_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_proxy_placements);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->top_proxy_disarms);
        Jupiter::DataBuffer::push<unsigned_int>(&buffer,&pEVar1->most_recent_ip);
        Jupiter::DataBuffer::push<long>(&buffer,&pEVar1->last_game);
        _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
        push<char,std::char_traits<char>,std::allocator<char>>(&buffer,&pEVar1->most_recent_name);
        Jupiter::DataBuffer::push_to((_IO_FILE *)&buffer);
        sVar3 = sVar3 + 1;
        ppEVar2 = &pEVar1->next;
      }
      fclose(in_RAX);
      in_RAX = (FILE *)Jupiter::DataBuffer::~DataBuffer(&buffer);
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void RenX::LadderDatabase::write(const char *filename) {
	if (m_entries != 0)
	{
		FILE *file = fopen(filename, "wb");
		if (file != nullptr)
		{
			size_t rank = 0;
			Jupiter::DataBuffer buffer;
			create_header(file);
			Entry *entry = m_head;
			while (entry != nullptr)
			{
				// update rank
				entry->rank = ++rank;

				// push data from entry to buffer
				buffer.push(entry->steam_id);
				buffer.push(entry->total_score);

				buffer.push(entry->total_kills);
				buffer.push(entry->total_deaths);
				buffer.push(entry->total_headshot_kills);
				buffer.push(entry->total_vehicle_kills);
				buffer.push(entry->total_building_kills);
				buffer.push(entry->total_defence_kills);
				buffer.push(entry->total_captures);
				buffer.push(entry->total_game_time);
				buffer.push(entry->total_games);
				buffer.push(entry->total_wins);
				buffer.push(entry->total_beacon_placements);
				buffer.push(entry->total_beacon_disarms);
				buffer.push(entry->total_proxy_placements);
				buffer.push(entry->total_proxy_disarms);

				buffer.push(entry->total_gdi_games);
				buffer.push(entry->total_gdi_wins);
				buffer.push(entry->total_gdi_ties);
				buffer.push(entry->total_gdi_game_time);
				buffer.push(entry->total_gdi_score);
				buffer.push(entry->total_gdi_beacon_placements);
				buffer.push(entry->total_gdi_beacon_disarms);
				buffer.push(entry->total_gdi_proxy_placements);
				buffer.push(entry->total_gdi_proxy_disarms);
				buffer.push(entry->total_gdi_kills);
				buffer.push(entry->total_gdi_deaths);
				buffer.push(entry->total_gdi_vehicle_kills);
				buffer.push(entry->total_gdi_defence_kills);
				buffer.push(entry->total_gdi_building_kills);
				buffer.push(entry->total_gdi_headshots);

				buffer.push(entry->total_nod_games);
				buffer.push(entry->total_nod_wins);
				buffer.push(entry->total_nod_game_time);
				buffer.push(entry->total_nod_score);
				buffer.push(entry->total_nod_beacon_placements);
				buffer.push(entry->total_nod_beacon_disarms);
				buffer.push(entry->total_nod_proxy_placements);
				buffer.push(entry->total_nod_proxy_disarms);
				buffer.push(entry->total_nod_kills);
				buffer.push(entry->total_nod_deaths);
				buffer.push(entry->total_nod_vehicle_kills);
				buffer.push(entry->total_nod_defence_kills);
				buffer.push(entry->total_nod_building_kills);
				buffer.push(entry->total_nod_headshots);

				buffer.push(entry->top_score);
				buffer.push(entry->top_kills);
				buffer.push(entry->most_deaths);
				buffer.push(entry->top_headshot_kills);
				buffer.push(entry->top_vehicle_kills);
				buffer.push(entry->top_building_kills);
				buffer.push(entry->top_defence_kills);
				buffer.push(entry->top_captures);
				buffer.push(entry->top_game_time);
				buffer.push(entry->top_beacon_placements);
				buffer.push(entry->top_beacon_disarms);
				buffer.push(entry->top_proxy_placements);
				buffer.push(entry->top_proxy_disarms);

				buffer.push(entry->most_recent_ip);
				buffer.push(entry->last_game);
				buffer.push(entry->most_recent_name);

				// push buffer to file
				buffer.push_to(file);

				// iterate
				entry = entry->next;
			}
			fclose(file);
		}
	}
}